

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringpiece.cc
# Opt level: O2

size_type __thiscall re2::StringPiece::rfind(StringPiece *this,StringPiece *s,size_type pos)

{
  int iVar1;
  char *pcVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  char *pcVar6;
  
  uVar4 = (ulong)this->length_;
  iVar1 = s->length_;
  lVar3 = (long)iVar1;
  if (this->length_ < iVar1) {
    pos = 0xffffffffffffffff;
  }
  else if (iVar1 == 0) {
    if (uVar4 < pos) {
      pos = uVar4;
    }
  }
  else {
    uVar5 = uVar4 - lVar3;
    if (pos <= uVar4 - lVar3) {
      uVar5 = pos;
    }
    pcVar6 = this->ptr_ + lVar3 + uVar5;
    pcVar2 = std::__find_end<char_const*,char_const*,__gnu_cxx::__ops::_Iter_equal_to_iter>
                       (this->ptr_,pcVar6,s->ptr_,s->ptr_ + lVar3);
    pos = 0xffffffffffffffff;
    if (pcVar2 != pcVar6) {
      pos = (long)pcVar2 - (long)this->ptr_;
    }
  }
  return pos;
}

Assistant:

StringPiece::size_type StringPiece::rfind(const StringPiece& s,
                                          size_type pos) const {
  if (length_ < s.length_) return npos;
  const size_type ulen = length_;
  if (s.length_ == 0) return min(ulen, pos);

  const char* last = ptr_ + min(ulen - s.length_, pos) + s.length_;
  const char* result = std::find_end(ptr_, last, s.ptr_, s.ptr_ + s.length_);
  return result != last ? result - ptr_ : npos;
}